

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
xLearn::FFMParser::Parse(FFMParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  ostream *poVar3;
  uint64 uVar4;
  char *pcVar5;
  reference pvVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  double dVar10;
  index_t field_id_1;
  real_t value_1;
  index_t idx_1;
  char *value_char_1;
  char *idx_char_1;
  char *field_char_1;
  index_t field_id;
  real_t value;
  index_t idx;
  char *value_char;
  char *idx_char;
  char *field_char;
  real_t norm;
  char *y_char;
  int i;
  uint64 rd_size;
  uint64 pos;
  DMatrix *in_stack_fffffffffffffdf0;
  DMatrix *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe58;
  string *function;
  undefined8 in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  uint64 in_stack_fffffffffffffe70;
  LogSeverity LVar11;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  Parser *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffed0;
  index_t in_stack_fffffffffffffed8;
  index_t in_stack_fffffffffffffedc;
  float in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  float local_fc;
  allocator local_d1;
  string local_d0 [39];
  undefined1 local_a9 [33];
  Logger local_88;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  Logger local_28;
  byte local_21;
  long local_20;
  ulong local_18;
  
  iVar9 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_21 = in_R8B & 1;
  if (in_RSI == 0) {
    Logger::Logger(&local_28,ERR);
    LVar11 = (LogSeverity)(in_stack_fffffffffffffe70 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Parse",&local_81);
    poVar2 = Logger::Start(LVar11,in_stack_fffffffffffffe68,iVar9,in_stack_fffffffffffffe58);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8b);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"buf");
    std::operator<<(poVar2," == NULL \n");
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    Logger::~Logger((Logger *)in_stack_fffffffffffffdf0);
    abort();
  }
  if (in_RDX != 0) {
    local_20 = in_RCX;
    if (local_21 != 0) {
      DMatrix::Reset(in_stack_fffffffffffffe30);
    }
    while (uVar4 = Parser::get_line_from_buffer
                             (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                              in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                              (uint64)in_stack_fffffffffffffe68), uVar4 != 0) {
      DMatrix::AddRow(in_stack_fffffffffffffdf0);
      iVar9 = *(int *)(local_20 + 0x10) + -1;
      if ((*(byte *)(in_RDI + 8) & 1) == 0) {
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_20 + 0x30),(long)iVar9);
        *pvVar6 = -2.0;
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pcVar5 = strtok(line_buf,pcVar5);
        dVar10 = atof(pcVar5);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_20 + 0x30),(long)iVar9);
        *pvVar6 = (float)dVar10;
      }
      local_fc = 0.0;
      if ((*(byte *)(in_RDI + 8) & 1) == 0) {
        pcVar5 = strtok(line_buf,":");
        pcVar7 = strtok((char *)0x0,":");
        pcVar8 = (char *)std::__cxx11::string::c_str();
        pcVar8 = strtok((char *)0x0,pcVar8);
        if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\n')) {
          in_stack_fffffffffffffee4 = atoi(pcVar7);
          dVar10 = atof(pcVar8);
          in_stack_fffffffffffffee0 = (float)dVar10;
          in_stack_fffffffffffffedc = atoi(pcVar5);
          DMatrix::AddNode((DMatrix *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                           (real_t)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                           (index_t)in_stack_fffffffffffffed0);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_fffffffffffffee0),
                                   ZEXT416((uint)in_stack_fffffffffffffee0),ZEXT416(0));
          local_fc = auVar1._0_4_;
        }
      }
      while( true ) {
        in_stack_fffffffffffffed0 = strtok((char *)0x0,":");
        pcVar5 = strtok((char *)0x0,":");
        pcVar7 = (char *)std::__cxx11::string::c_str();
        pcVar7 = strtok((char *)0x0,pcVar7);
        if ((in_stack_fffffffffffffed0 == (char *)0x0) || (*in_stack_fffffffffffffed0 == '\n'))
        break;
        atoi(pcVar5);
        dVar10 = atof(pcVar7);
        atoi(in_stack_fffffffffffffed0);
        DMatrix::AddNode((DMatrix *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                         (real_t)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                         (index_t)in_stack_fffffffffffffed0);
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)(float)dVar10),ZEXT416((uint)(float)dVar10),
                                 ZEXT416((uint)local_fc));
        local_fc = auVar1._0_4_;
      }
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_20 + 0x48),(long)iVar9);
      *pvVar6 = 1.0 / local_fc;
    }
    return;
  }
  local_18 = in_RDX;
  Logger::Logger(&local_88,ERR);
  LVar11 = (LogSeverity)(in_stack_fffffffffffffe70 >> 0x20);
  function = (string *)local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_a9 + 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
             ,(allocator *)function);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"Parse",&local_d1);
  poVar2 = Logger::Start(LVar11,in_stack_fffffffffffffe68,iVar9,function);
  poVar2 = std::operator<<(poVar2,"CHECK_GT failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8c);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"size");
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"0");
  poVar2 = std::operator<<(poVar2," = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar2,0);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)(local_a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a9);
  Logger::~Logger((Logger *)poVar2);
  abort();
}

Assistant:

void FFMParser::Parse(char* buf, 
                      uint64 size, 
                      DMatrix& matrix,
                      bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    // Add Y
    if (has_label_) {  // for training task
      char *y_char = strtok(line_buf, splitor_.c_str());
      matrix.Y[i] = atof(y_char);
    } else {  // for predict task
      matrix.Y[i] = -2;
    }
    // Add features
    real_t norm = 0.0;
    // The first element
    if (!has_label_) {
      char *field_char = strtok(line_buf, ":");
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char != nullptr && *idx_char != '\n') {
        index_t idx = atoi(idx_char);
        real_t value = atof(value_char);
        index_t field_id = atoi(field_char);
        matrix.AddNode(i, idx, value, field_id);
        norm += value*value;
      }
    }
    // The remain elements
    for (;;) {
      char *field_char = strtok(nullptr, ":");
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (field_char == nullptr || *field_char == '\n') {
        break;
      }
      index_t idx = atoi(idx_char);
      real_t value = atof(value_char);
      index_t field_id = atoi(field_char);
      matrix.AddNode(i, idx, value, field_id);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}